

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Sym * find_global_D_Sym(D_Scope *st,char *name,char *end)

{
  uint h;
  size_t sVar1;
  D_Sym *pDVar2;
  D_Scope *cur;
  int l;
  
  if (end == (char *)0x0) {
    sVar1 = strlen(name);
    l = (int)sVar1;
  }
  else {
    l = (int)end - (int)name;
  }
  h = strhashl(name,l);
  for (cur = st; cur->up != (D_Scope *)0x0; cur = cur->search) {
  }
  pDVar2 = find_D_Sym_internal(cur,name,l,h);
  if (pDVar2 != (D_Sym *)0x0) {
    pDVar2 = current_D_Sym(st,pDVar2);
    return pDVar2;
  }
  return (D_Sym *)0x0;
}

Assistant:

D_Sym *find_global_D_Sym(D_Scope *st, char *name, char *end) {
  D_Sym *s;
  uint len = end ? end - name : strlen(name);
  uint h = strhashl(name, len);
  D_Scope *cur = st;
  while (cur->up) cur = cur->search;
  s = find_D_Sym_internal(cur, name, len, h);
  if (s) return current_D_Sym(st, s);
  return NULL;
}